

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O2

bool __thiscall
tinyusdz::InheritPrimSpec(tinyusdz *this,PrimSpec *dst,PrimSpec *src,string *warn,string *err)

{
  string *__rhs;
  _Rb_tree_node_base *__x;
  PropertyMap *this_00;
  long lVar1;
  PrimSpec *pPVar2;
  __type _Var3;
  bool bVar4;
  size_type sVar5;
  Property *this_01;
  _Rb_tree_node_base *p_Var6;
  long lVar7;
  long lVar8;
  PrimSpec *src_00;
  PrimSpec *pPVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  PrimSpec *dst_00;
  PrimSpec ps;
  
  PrimSpec::PrimSpec(&ps,dst);
  ::std::__cxx11::string::_M_assign((string *)&ps._name);
  if (*(long *)(this + 0x10) != 0) {
    ::std::__cxx11::string::_M_assign((string *)&ps._typeName);
  }
  ps._specifier = *(Specifier *)this;
  this_00 = &ps._props;
  PrimMetas::update_from(&ps._metas,(PrimMetas *)(this + 0x138),true);
  for (p_Var6 = *(_Rb_tree_node_base **)(this + 0x78);
      dst_00 = ps._children.
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_start, p_Var6 != (_Rb_tree_node_base *)(this + 0x68);
      p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6)) {
    __x = p_Var6 + 1;
    sVar5 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::count(this_00,(key_type *)__x);
    if (sVar5 == 0) {
      this_01 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::operator[](this_00,(key_type *)__x);
    }
    else {
      this_01 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                ::at(this_00,(key_type *)__x);
    }
    Property::operator=(this_01,(Property *)(p_Var6 + 2));
  }
  for (; dst_00 != ps._children.
                   super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                   _M_impl.super__Vector_impl_data._M_finish; dst_00 = dst_00 + 1) {
    lVar1 = *(long *)(this + 0x48);
    pPVar2 = *(PrimSpec **)(this + 0x50);
    __rhs = &dst_00->_name;
    lVar7 = 0;
    for (lVar8 = ((long)pPVar2 - lVar1) / 0x568 >> 2;
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (lVar7 + lVar1 + 0x28), 0 < lVar8; lVar8 = lVar8 + -1) {
      _Var3 = ::std::operator==(__lhs,__rhs);
      if (_Var3) {
        src_00 = (PrimSpec *)(lVar1 + lVar7);
        goto LAB_001759a4;
      }
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar7 + lVar1 + 0x590),__rhs);
      if (_Var3) {
        src_00 = (PrimSpec *)(lVar7 + lVar1 + 0x568);
        goto LAB_001759a4;
      }
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar7 + lVar1 + 0xaf8),__rhs);
      if (_Var3) {
        src_00 = (PrimSpec *)(lVar7 + lVar1 + 0xad0);
        goto LAB_001759a4;
      }
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar7 + lVar1 + 0x1060),__rhs);
      if (_Var3) {
        src_00 = (PrimSpec *)(lVar7 + lVar1 + 0x1038);
        goto LAB_001759a4;
      }
      lVar7 = lVar7 + 0x15a0;
    }
    lVar8 = (((long)pPVar2 - lVar1) - lVar7) / 0x568;
    pPVar9 = (PrimSpec *)(lVar7 + lVar1);
    if (lVar8 == 1) {
LAB_00175a01:
      _Var3 = ::std::operator==(&pPVar9->_name,__rhs);
      src_00 = pPVar9;
      if (!_Var3) {
        src_00 = pPVar2;
      }
    }
    else if (lVar8 == 3) {
      _Var3 = ::std::operator==(__lhs,__rhs);
      src_00 = pPVar9;
      if (!_Var3) {
        pPVar9 = (PrimSpec *)(lVar7 + lVar1 + 0x568);
        goto LAB_001759e4;
      }
    }
    else {
      src_00 = pPVar2;
      if (lVar8 == 2) {
LAB_001759e4:
        _Var3 = ::std::operator==(&pPVar9->_name,__rhs);
        src_00 = pPVar9;
        if (!_Var3) {
          pPVar9 = pPVar9 + 1;
          goto LAB_00175a01;
        }
      }
    }
LAB_001759a4:
    if ((src_00 != *(PrimSpec **)(this + 0x50)) &&
       (bVar4 = detail::OverridePrimSpecRec(1,dst_00,src_00,warn,err), !bVar4)) goto LAB_00175a24;
  }
  PrimSpec::operator=((PrimSpec *)this,&ps);
LAB_00175a24:
  PrimSpec::~PrimSpec(&ps);
  return dst_00 == ps._children.
                   super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool InheritPrimSpec(PrimSpec &dst, const PrimSpec &src, std::string *warn,
                     std::string *err) {
  return detail::InheritPrimSpecImpl(dst, src, warn, err);
}